

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_sub(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  mp_int *in_RSI;
  mp_int *in_RDI;
  int res;
  int sb;
  int sa;
  mp_int *in_stack_00000028;
  int local_24;
  
  iVar1 = in_RDI->sign;
  if (iVar1 == in_RSI->sign) {
    iVar2 = mp_cmp_mag(in_RDI,in_RSI);
    if (iVar2 == -1) {
      *(uint *)(in_RDX + 8) = (uint)(iVar1 == 0);
      local_24 = s_mp_sub(b,c,_sb);
    }
    else {
      *(int *)(in_RDX + 8) = iVar1;
      local_24 = s_mp_sub(b,c,_sb);
    }
  }
  else {
    *(int *)(in_RDX + 8) = iVar1;
    local_24 = s_mp_add(in_stack_00000028,a,b);
  }
  return local_24;
}

Assistant:

int mp_sub (mp_int * a, mp_int * b, mp_int * c)
{
  int     sa, sb, res;

  sa = a->sign;
  sb = b->sign;

  if (sa != sb) {
    /* subtract a negative from a positive, OR */
    /* subtract a positive from a negative. */
    /* In either case, ADD their magnitudes, */
    /* and use the sign of the first number. */
    c->sign = sa;
    res = s_mp_add (a, b, c);
  } else {
    /* subtract a positive from a positive, OR */
    /* subtract a negative from a negative. */
    /* First, take the difference between their */
    /* magnitudes, then... */
    if (mp_cmp_mag (a, b) != MP_LT) {
      /* Copy the sign from the first */
      c->sign = sa;
      /* The first has a larger or equal magnitude */
      res = s_mp_sub (a, b, c);
    } else {
      /* The result has the *opposite* sign from */
      /* the first number. */
      c->sign = (sa == MP_ZPOS) ? MP_NEG : MP_ZPOS;
      /* The second has a larger magnitude */
      res = s_mp_sub (b, a, c);
    }
  }
  return res;
}